

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elements.c
# Opt level: O3

int wally_asset_unblind_with_nonce
              (uchar *nonce_hash,size_t nonce_hash_len,uchar *proof,size_t proof_len,
              uchar *commitment,size_t commitment_len,uchar *extra,size_t extra_len,uchar *generator
              ,size_t generator_len,uchar *asset_out,size_t asset_out_len,uchar *abf_out,
              size_t abf_out_len,uchar *vbf_out,size_t vbf_out_len,uint64_t *value_out)

{
  int iVar1;
  int iVar2;
  secp256k1_context_struct *ctx;
  undefined4 uVar3;
  size_t sVar4;
  undefined7 uVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  size_t message_len;
  uint64_t max_value;
  uint64_t min_value;
  uchar message [64];
  secp256k1_pedersen_commitment commit;
  secp256k1_generator gen;
  
  sVar4 = proof_len;
  ctx = secp_ctx();
  message_len = 0x40;
  if (ctx == (secp256k1_context_struct *)0x0) {
    return -3;
  }
  uVar5 = (undefined7)(sVar4 >> 8);
  if (((((proof_len != 0 && nonce_hash_len == 0x20) &&
         (proof != (uchar *)0x0 && nonce_hash != (uchar *)0x0)) &&
       (commitment_len == 0x21 && commitment != (uchar *)0x0)) &&
      (iVar1 = secp256k1_pedersen_commitment_parse(ctx,&commit,commitment), iVar1 != 0)) &&
     (extra != (uchar *)0x0 || extra_len == 0)) {
    uVar3 = (undefined4)CONCAT71(uVar5,generator_len != 0x21 || generator == (uchar *)0x0);
    if (generator_len != 0x21 || generator == (uchar *)0x0) {
      bVar6 = false;
    }
    else {
      iVar1 = secp256k1_generator_parse(ctx,&gen,generator);
      bVar6 = iVar1 != 0;
    }
    auVar7._0_4_ = -(uint)(asset_out == (uchar *)0x0);
    auVar7._4_4_ = -(uint)(abf_out == (uchar *)0x0);
    auVar7._8_4_ = -(uint)(vbf_out == (uchar *)0x0);
    auVar7._12_4_ = -(uint)(value_out == (uint64_t *)0x0);
    iVar1 = movmskps(uVar3,auVar7);
    if (((iVar1 == 0) && (asset_out_len == 0x20)) &&
       ((abf_out_len == 0x20 && ((vbf_out_len == 0x20 && (bVar6)))))) {
      iVar2 = secp256k1_rangeproof_rewind
                        (ctx,vbf_out,value_out,message,&message_len,nonce_hash,&min_value,&max_value
                         ,&commit,proof,proof_len,extra,extra_len,&gen);
      iVar1 = -2;
      if (iVar2 != 0) {
        *(undefined8 *)(asset_out + 0x10) = message._16_8_;
        *(undefined8 *)(asset_out + 0x18) = message._24_8_;
        *(undefined8 *)asset_out = message._0_8_;
        *(undefined8 *)(asset_out + 8) = message._8_8_;
        *(undefined8 *)(abf_out + 0x10) = message._48_8_;
        *(undefined8 *)(abf_out + 0x18) = message._56_8_;
        *(undefined8 *)abf_out = message._32_8_;
        *(undefined8 *)(abf_out + 8) = message._40_8_;
        iVar1 = 0;
      }
      goto LAB_0049e3b9;
    }
  }
  iVar1 = -2;
LAB_0049e3b9:
  wally_clear_3(&gen,0x40,&commit,0x40,message,0x40);
  return iVar1;
}

Assistant:

int wally_asset_unblind_with_nonce(const unsigned char *nonce_hash, size_t nonce_hash_len,
                                   const unsigned char *proof, size_t proof_len,
                                   const unsigned char *commitment, size_t commitment_len,
                                   const unsigned char *extra, size_t extra_len,
                                   const unsigned char *generator, size_t generator_len,
                                   unsigned char *asset_out, size_t asset_out_len,
                                   unsigned char *abf_out, size_t abf_out_len,
                                   unsigned char *vbf_out, size_t vbf_out_len,
                                   uint64_t *value_out)
{
    const secp256k1_context *ctx = secp_ctx();
    secp256k1_generator gen;
    secp256k1_pedersen_commitment commit;
    unsigned char message[ASSET_TAG_LEN * 2];
    size_t message_len = sizeof(message);
    uint64_t min_value, max_value;
    int ret = WALLY_EINVAL;

    if (!ctx)
        return WALLY_ENOMEM;

    if (!nonce_hash || nonce_hash_len != SHA256_LEN ||
        !proof || !proof_len ||
        get_commitment(ctx, commitment, commitment_len, &commit) != WALLY_OK ||
        (extra_len && !extra) ||
        get_generator(ctx, generator, generator_len, &gen) != WALLY_OK ||
        !asset_out || asset_out_len != ASSET_TAG_LEN ||
        !abf_out || abf_out_len != BLINDING_FACTOR_LEN ||
        !vbf_out || vbf_out_len != BLINDING_FACTOR_LEN || !value_out)
        goto cleanup;

    /* Extract the value blinding factor, value and message from the rangeproof */
    if (!secp256k1_rangeproof_rewind(ctx, vbf_out, value_out,
                                     message, &message_len,
                                     nonce_hash, &min_value, &max_value,
                                     &commit, proof, proof_len,
                                     extra, extra_len,
                                     &gen))
        goto cleanup;

    /* FIXME: check results per blind.cpp */

    /* Extract the asset id and asset blinding factor from the message */
    memcpy(asset_out, message, ASSET_TAG_LEN);
    memcpy(abf_out, message + ASSET_TAG_LEN, ASSET_TAG_LEN);
    ret = WALLY_OK;

cleanup:
    wally_clear_3(&gen, sizeof(gen), &commit, sizeof(commit),
                  message, sizeof(message));
    return ret;
}